

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O2

void __thiscall
duckdb::ArrowTypeExtension::ArrowTypeExtension
          (ArrowTypeExtension *this,ArrowExtensionMetadata *extension_metadata,
          unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> *type)

{
  pointer this_00;
  undefined1 local_40 [40];
  
  this->populate_arrow_schema = (populate_arrow_schema_t)0x0;
  this->get_type = (get_type_t)0x0;
  ArrowExtensionMetadata::ArrowExtensionMetadata(&this->extension_metadata,extension_metadata);
  (this->type_extension).internal.
  super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->type_extension).internal.
  super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>::operator->
                      (type);
  ArrowType::GetDuckType((LogicalType *)(local_40 + 0x10),this_00,false);
  make_shared_ptr<duckdb::ArrowTypeExtensionData,duckdb::LogicalType>((LogicalType *)local_40);
  shared_ptr<duckdb::ArrowTypeExtensionData,_true>::operator=
            (&this->type_extension,(shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)local_40);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  LogicalType::~LogicalType((LogicalType *)(local_40 + 0x10));
  return;
}

Assistant:

ArrowTypeExtension::ArrowTypeExtension(ArrowExtensionMetadata &extension_metadata, unique_ptr<ArrowType> type)
    : extension_metadata(extension_metadata) {
	type_extension = make_shared_ptr<ArrowTypeExtensionData>(type->GetDuckType());
}